

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O3

JsonArray * __thiscall Json::JsonDocument::array(JsonDocument *this)

{
  element_type *peVar1;
  int iVar2;
  JsonArray *pJVar3;
  
  peVar1 = (this->jsonValuePtr).super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**peVar1->_vptr_JsonValue)();
    if ((iVar2 == 1) &&
       (peVar1 = (this->jsonValuePtr).
                 super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar1 != (element_type *)0x0)) {
      pJVar3 = (JsonArray *)__dynamic_cast(peVar1,&JsonValue::typeinfo,&JsonArray::typeinfo,0);
      return pJVar3;
    }
  }
  return (JsonArray *)0x0;
}

Assistant:

JsonArray *JsonDocument::array() {
        if (!isArray())return nullptr;
        return dynamic_cast<JsonArray *>(jsonValuePtr.get());
    }